

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::_tls_policy::get(_tls_policy *this,service *srv)

{
  application *this_00;
  application *in_RSI;
  application *in_RDI;
  application *app;
  application *this_01;
  
  this_01 = in_RDI;
  this_00 = booster::thread_specific_ptr<cppcms::application>::release
                      ((thread_specific_ptr<cppcms::application> *)in_RDI);
  if (this_00 == (application *)0x0) {
    _policy::get_new((_policy *)this_01,(service *)in_RDI);
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr
              ((intrusive_ptr<cppcms::application> *)this_00,in_RSI,SUB81((ulong)this_01 >> 0x38,0))
    ;
  }
  else {
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr
              ((intrusive_ptr<cppcms::application> *)this_00,in_RSI,SUB81((ulong)this_01 >> 0x38,0))
    ;
  }
  return (intrusive_ptr<cppcms::application>)this_01;
}

Assistant:

virtual booster::intrusive_ptr<application> get(cppcms::service &srv)
	{
		application *app = tss_.release();
		if(!app)
			return get_new(srv);
		return app;
	}